

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  byte bVar1;
  uchar uVar2;
  uint uVar3;
  uchar *puVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  byte *pbVar11;
  ulong uVar12;
  int iVar13;
  long in_FS_OFFSET;
  
  if (req_comp != img_n) {
    if (3 < req_comp - 1U) {
      __assert_fail("req_comp >= 1 && req_comp <= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image.h"
                    ,0x6a4,
                    "unsigned char *stbi__convert_format(unsigned char *, int, int, unsigned int, unsigned int)"
                   );
    }
    puVar4 = (uchar *)stbi__malloc_mad3(req_comp,x,y,x);
    if (puVar4 == (uchar *)0x0) {
      free(data);
      *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
      data = (uchar *)0x0;
    }
    else {
      uVar3 = 0;
      if ((int)y < 1) {
        y = 0;
      }
      iVar13 = req_comp + img_n * 8;
      iVar5 = x - 1;
      uVar12 = 0;
      for (uVar10 = 0; uVar10 != y; uVar10 = uVar10 + 1) {
        if (0x19 < iVar13 - 10U) {
switchD_0013d1e9_caseD_d:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image.h"
                        ,0x6c1,
                        "unsigned char *stbi__convert_format(unsigned char *, int, int, unsigned int, unsigned int)"
                       );
        }
        uVar9 = (ulong)uVar3;
        iVar6 = (int)uVar10 * x;
        pbVar11 = data + (uint)(iVar6 * img_n);
        pbVar7 = puVar4 + (uint)(iVar6 * req_comp);
        switch(iVar13) {
        case 10:
          lVar8 = 0;
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            puVar4[lVar8 * 2 + uVar9] = data[lVar8 + uVar12];
            puVar4[lVar8 * 2 + uVar9 + 1] = 0xff;
            lVar8 = lVar8 + 1;
          }
          break;
        case 0xb:
          pbVar7 = puVar4 + uVar9 + 2;
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            bVar1 = *pbVar11;
            *pbVar7 = bVar1;
            pbVar7[-1] = bVar1;
            pbVar7[-2] = bVar1;
            pbVar11 = pbVar11 + 1;
            pbVar7 = pbVar7 + 3;
          }
          break;
        case 0xc:
          lVar8 = 0;
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            uVar2 = data[lVar8 + uVar12];
            puVar4[lVar8 * 4 + uVar9 + 2] = uVar2;
            puVar4[lVar8 * 4 + uVar9 + 1] = uVar2;
            puVar4[lVar8 * 4 + uVar9] = uVar2;
            puVar4[lVar8 * 4 + uVar9 + 3] = 0xff;
            lVar8 = lVar8 + 1;
          }
          break;
        default:
          goto switchD_0013d1e9_caseD_d;
        case 0x11:
          lVar8 = 0;
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            puVar4[lVar8 + uVar9] = data[lVar8 * 2 + uVar12];
            lVar8 = lVar8 + 1;
          }
          break;
        case 0x13:
          pbVar7 = puVar4 + uVar9 + 2;
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            bVar1 = *pbVar11;
            *pbVar7 = bVar1;
            pbVar7[-1] = bVar1;
            pbVar7[-2] = bVar1;
            pbVar11 = pbVar11 + 2;
            pbVar7 = pbVar7 + 3;
          }
          break;
        case 0x14:
          lVar8 = 0;
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            uVar2 = data[lVar8 + uVar12];
            puVar4[lVar8 * 2 + uVar9 + 2] = uVar2;
            puVar4[lVar8 * 2 + uVar9 + 1] = uVar2;
            puVar4[lVar8 * 2 + uVar9] = uVar2;
            puVar4[lVar8 * 2 + uVar9 + 3] = data[lVar8 + uVar12 + 1];
            lVar8 = lVar8 + 2;
          }
          break;
        case 0x19:
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            *pbVar7 = (byte)((uint)pbVar11[2] * 0x1d +
                             (uint)pbVar11[1] * 0x96 + (uint)*pbVar11 * 0x4d >> 8);
            pbVar11 = pbVar11 + 3;
            pbVar7 = pbVar7 + 1;
          }
          break;
        case 0x1a:
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            *pbVar7 = (byte)((uint)pbVar11[2] * 0x1d +
                             (uint)pbVar11[1] * 0x96 + (uint)*pbVar11 * 0x4d >> 8);
            pbVar7[1] = 0xff;
            pbVar11 = pbVar11 + 3;
            pbVar7 = pbVar7 + 2;
          }
          break;
        case 0x1c:
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            *pbVar7 = *pbVar11;
            pbVar7[1] = pbVar11[1];
            pbVar7[2] = pbVar11[2];
            pbVar7[3] = 0xff;
            pbVar11 = pbVar11 + 3;
            pbVar7 = pbVar7 + 4;
          }
          break;
        case 0x21:
          lVar8 = 0;
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            puVar4[lVar8 + uVar9] =
                 (uchar)((uint)data[lVar8 * 4 + uVar12 + 2] * 0x1d +
                         (uint)data[lVar8 * 4 + uVar12 + 1] * 0x96 +
                         (uint)data[lVar8 * 4 + uVar12] * 0x4d >> 8);
            lVar8 = lVar8 + 1;
          }
          break;
        case 0x22:
          lVar8 = 0;
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            puVar4[lVar8 + uVar9] =
                 (uchar)((uint)data[lVar8 * 2 + uVar12 + 2] * 0x1d +
                         (uint)data[lVar8 * 2 + uVar12 + 1] * 0x96 +
                         (uint)data[lVar8 * 2 + uVar12] * 0x4d >> 8);
            puVar4[lVar8 + uVar9 + 1] = data[lVar8 * 2 + uVar12 + 3];
            lVar8 = lVar8 + 2;
          }
          break;
        case 0x23:
          for (iVar6 = iVar5; -1 < iVar6; iVar6 = iVar6 + -1) {
            *pbVar7 = *pbVar11;
            pbVar7[1] = pbVar11[1];
            pbVar7[2] = pbVar11[2];
            pbVar11 = pbVar11 + 4;
            pbVar7 = pbVar7 + 3;
          }
        }
        uVar12 = (ulong)((int)uVar12 + x * img_n);
        uVar3 = uVar3 + x * req_comp;
      }
      free(data);
      data = puVar4;
    }
  }
  return data;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc_mad3(req_comp, x, y, 0);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=255;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=255;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                  } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                  } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=255;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = 255;    } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                    } break;
         default: STBI_ASSERT(0); STBI_FREE(data); STBI_FREE(good); return stbi__errpuc("unsupported", "Unsupported format conversion");
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}